

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cc
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* onmt::split_string(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *__return_storage_ptr__,string *str,string *separator,bool skip_empty)

{
  ulong uVar1;
  size_t offset;
  size_t length;
  unsigned_long local_40;
  unsigned_long local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (str->_M_string_length != 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(__return_storage_ptr__,str->_M_string_length >> 1);
    local_40 = 0;
    do {
      uVar1 = std::__cxx11::string::find((string *)str,(ulong)separator);
      if (uVar1 == 0xffffffffffffffff) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string_const&,unsigned_long&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,str,&local_40);
        return __return_storage_ptr__;
      }
      local_38 = uVar1 - local_40;
      if ((!skip_empty) || (uVar1 != local_40)) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string_const&,unsigned_long&,unsigned_long_const&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,str,&local_40,&local_38);
      }
      local_40 = uVar1 + separator->_M_string_length;
    } while (local_40 < str->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> split_string(const std::string& str,
                                        const std::string& separator,
                                        bool skip_empty)
  {
    std::vector<std::string> parts;
    if (str.size() == 0)
      return parts;

    parts.reserve(str.size() / 2);

    size_t offset = 0;
    do {
      const size_t index = str.find(separator, offset);
      if (index == std::string::npos) {
        parts.emplace_back(str, offset);
        break;
      }

      const size_t length = index - offset;
      if (!skip_empty || length > 0)
        parts.emplace_back(str, offset, length);
      offset = index + separator.size();
    } while (offset < str.size());

    return parts;
  }